

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_alias.cpp
# Opt level: O3

string * duckdb::ExtensionHelper::ApplyExtensionAlias
                   (string *__return_storage_ptr__,string *extension_name)

{
  long lVar1;
  int iVar2;
  long lVar3;
  undefined1 *puVar4;
  allocator local_41;
  string local_40;
  
  StringUtil::Lower(&local_40,(string *)extension_name);
  iVar2 = ::std::__cxx11::string::compare((char *)&local_40);
  if (iVar2 == 0) {
    puVar4 = internal_aliases;
  }
  else {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      lVar1 = lVar3 + 0x10;
      if (lVar1 == 0x80) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p == &local_40.field_2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               local_40.field_2._M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_40.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = local_40._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               local_40.field_2._M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = local_40._M_string_length;
        return __return_storage_ptr__;
      }
      iVar2 = ::std::__cxx11::string::compare((char *)&local_40);
    } while (iVar2 != 0);
    puVar4 = (undefined1 *)(lVar3 + 0x24613f0);
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,*(char **)(puVar4 + 8),&local_41);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string ExtensionHelper::ApplyExtensionAlias(const string &extension_name) {
	auto lname = StringUtil::Lower(extension_name);
	for (idx_t index = 0; internal_aliases[index].alias; index++) {
		if (lname == internal_aliases[index].alias) {
			return internal_aliases[index].extension;
		}
	}
	return lname;
}